

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O0

ByteData * __thiscall cfd::SignParameter::ConvertToSignature(SignParameter *this)

{
  byte bVar1;
  undefined8 uVar2;
  long in_RSI;
  CfdException *in_RDI;
  ByteData *byte_data;
  ByteData *in_stack_ffffffffffffff28;
  CfdSourceLocation *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff40;
  CfdError error_code;
  CfdException *this_00;
  SigHashType local_a0 [32];
  string local_80 [30];
  undefined1 local_62;
  allocator local_61;
  string local_60 [32];
  char *local_40;
  undefined4 local_38;
  char *local_30;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  cfd::core::ByteData::ByteData((ByteData *)in_RDI);
  error_code = (CfdError)((ulong)in_RDI >> 0x20);
  if ((*(byte *)(in_RSI + 0x38) & 1) == 0) {
    core::ByteData::operator=((ByteData *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  else {
    bVar1 = cfd::core::ByteData::Empty();
    if ((bVar1 & 1) != 0) {
      local_40 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/src/cfd_transaction_common.cpp"
                         ,0x2f);
      local_40 = local_40 + 1;
      local_38 = 0x1d6;
      local_30 = "ConvertToSignature";
      core::logger::warn<>(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
      local_62 = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"Invalid hex string. empty sign data.",&local_61);
      core::CfdException::CfdException
                (this_00,error_code,(string *)CONCAT17(bVar1,in_stack_ffffffffffffff40));
      local_62 = 0;
      __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    cfd::core::ByteData::GetHex_abi_cxx11_();
    cfd::core::CryptoUtil::ConvertSignatureToDer(local_80,local_a0);
    core::ByteData::operator=((ByteData *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    core::ByteData::~ByteData((ByteData *)0x39547c);
    std::__cxx11::string::~string((string *)local_a0);
  }
  return (ByteData *)this_00;
}

Assistant:

ByteData SignParameter::ConvertToSignature() const {
  ByteData byte_data;
  if (der_encode_) {
    if (data_.Empty()) {
      warn(CFD_LOG_SOURCE, "Failed to ConvertToSignature. sign hex empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid hex string. empty sign data.");
    }
    byte_data =
        CryptoUtil::ConvertSignatureToDer(data_.GetHex(), sighash_type_);
  } else {
    byte_data = data_;
  }
  return byte_data;
}